

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O0

longlong __thiscall
manager::Manager<uttt::IBoard>::AddBot(Manager<uttt::IBoard> *this,IBot<uttt::IBoard> *bot)

{
  long lVar1;
  mapped_type __k;
  mapped_type *ppBVar2;
  IBot<uttt::IBoard> *in_RDI;
  Bot<uttt::IBoard> *m_bot;
  longlong id;
  double in_stack_ffffffffffffffb8;
  Bot<uttt::IBoard> *in_stack_ffffffffffffffd0;
  
  lVar1 = g_bot_ids;
  g_bot_ids = g_bot_ids + 1;
  __k = (mapped_type)operator_new(0x18);
  Bot<uttt::IBoard>::Bot(in_stack_ffffffffffffffd0,(longlong)__k,in_RDI,in_stack_ffffffffffffffb8);
  ppBVar2 = std::
            unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
            ::operator[]((unordered_map<long_long,_manager::Bot<uttt::IBoard>_*,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>_>
                          *)in_RDI,&__k->id);
  *ppBVar2 = __k;
  return lVar1;
}

Assistant:

long long
Manager<IGame>::AddBot(const game::IBot<IGame> *bot)
{
    long long id = g_bot_ids;
    ++g_bot_ids;

    auto m_bot = new Bot<IGame>(id, bot, g_default_rating);
    bots[id] = m_bot;
    return id;
}